

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O0

void soul::replaceStringLiterals
               (Value *v,SubElementPath *path,StringDictionary *sourceDictionary,
               StringDictionary *destDictionary)

{
  ulong uVar1;
  bool bVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  ArraySize AVar4;
  Structure *this;
  size_t sVar5;
  undefined8 extraout_RDX;
  SubElementPath local_168;
  ulong local_130;
  size_t i_1;
  ulong local_f0;
  size_t i;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uint32_t local_d4;
  Value local_d0;
  uint32_t local_7c;
  undefined8 uStack_78;
  string_view s;
  Value value;
  StringDictionary *destDictionary_local;
  StringDictionary *sourceDictionary_local;
  SubElementPath *path_local;
  Value *v_local;
  
  Value::getSubElement((Value *)&s._M_str,v,path);
  pTVar3 = Value::getType((Value *)&s._M_str);
  bVar2 = Type::isStringLiteral(pTVar3);
  if (bVar2) {
    local_7c = (uint32_t)Value::getStringLiteral((Value *)&s._M_str);
    i._0_4_ = (*(sourceDictionary->super_StringDictionary)._vptr_StringDictionary[3])
                        (sourceDictionary,(ulong)local_7c);
    uStack_78 = CONCAT44(extraout_var,(int)i);
    s._M_len._0_4_ = (undefined4)extraout_RDX;
    s._M_len._4_4_ = (undefined4)((ulong)extraout_RDX >> 0x20);
    uStack_e0 = (undefined4)s._M_len;
    uStack_dc = s._M_len._4_4_;
    local_d4 = (*(destDictionary->super_StringDictionary)._vptr_StringDictionary[2])
                         (destDictionary,CONCAT44(extraout_var,(int)i),extraout_RDX);
    Value::createStringLiteral(&local_d0,(Handle)local_d4);
    Value::modifySubElementInPlace(v,path,&local_d0);
    Value::~Value(&local_d0);
  }
  else {
    pTVar3 = Value::getType((Value *)&s._M_str);
    bVar2 = Type::isFixedSizeArray(pTVar3);
    if (bVar2) {
      local_f0 = 0;
      while( true ) {
        uVar1 = local_f0;
        pTVar3 = Value::getType((Value *)&s._M_str);
        AVar4 = Type::getArraySize(pTVar3);
        if (AVar4 <= uVar1) break;
        SubElementPath::operator+((SubElementPath *)&i_1,path,local_f0);
        replaceStringLiterals(v,(SubElementPath *)&i_1,sourceDictionary,destDictionary);
        SubElementPath::~SubElementPath((SubElementPath *)&i_1);
        local_f0 = local_f0 + 1;
      }
    }
    else {
      pTVar3 = Value::getType((Value *)&s._M_str);
      bVar2 = Type::isStruct(pTVar3);
      if (bVar2) {
        local_130 = 0;
        while( true ) {
          uVar1 = local_130;
          pTVar3 = Value::getType((Value *)&s._M_str);
          this = Type::getStructRef(pTVar3);
          sVar5 = Structure::getNumMembers(this);
          if (sVar5 <= uVar1) break;
          SubElementPath::operator+(&local_168,path,local_130);
          replaceStringLiterals(v,&local_168,sourceDictionary,destDictionary);
          SubElementPath::~SubElementPath(&local_168);
          local_130 = local_130 + 1;
        }
      }
    }
  }
  Value::~Value((Value *)&s._M_str);
  return;
}

Assistant:

static void replaceStringLiterals (Value& v, SubElementPath path, const StringDictionary& sourceDictionary, StringDictionary& destDictionary)
{
    auto value = v.getSubElement (path);

    if (value.getType().isStringLiteral())
    {
        auto s = sourceDictionary.getStringForHandle (value.getStringLiteral());
        v.modifySubElementInPlace (path, Value::createStringLiteral (destDictionary.getHandleForString (s)));
    }
    else if (value.getType().isFixedSizeArray())
    {
        for (size_t i = 0; i < value.getType().getArraySize(); ++i)
             replaceStringLiterals (v, path + i, sourceDictionary, destDictionary);
    }
    else if (value.getType().isStruct())
    {
        for (size_t i = 0; i < value.getType().getStructRef().getNumMembers(); ++i)
             replaceStringLiterals (v, path + i, sourceDictionary, destDictionary);
    }
}